

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O0

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  uint x;
  void *__base;
  ogg_uint32_t **__ptr;
  ogg_uint32_t *sparsemap;
  static_codebook *psVar1;
  ogg_uint32_t oVar2;
  int iVar3;
  ogg_uint32_t *poVar4;
  void *pvVar5;
  ogg_int32_t *poVar6;
  long *plVar7;
  int *maxpoint;
  size_t sVar8;
  long lVar9;
  ogg_uint32_t aoStack_b0 [2];
  ogg_uint32_t oStack_a8;
  uint local_a4;
  long local_a0;
  bool local_92;
  bool local_91;
  long local_90;
  ogg_uint32_t local_84;
  ulong local_80;
  unsigned_long hival;
  unsigned_long loval;
  long lStack_68;
  ogg_uint32_t word;
  long hi;
  long lo;
  ogg_uint32_t local_50;
  ogg_uint32_t mask;
  ogg_uint32_t orig;
  int position;
  ogg_uint32_t **codep;
  ogg_uint32_t *codes;
  int *sortindex;
  int tabn;
  int n;
  int j;
  int i;
  static_codebook *s_local;
  codebook *c_local;
  
  sortindex._4_4_ = 0;
  aoStack_b0[0] = 0x130baa;
  aoStack_b0[1] = 0;
  _j = s;
  s_local = (static_codebook *)c;
  memset(c,0,0x60);
  for (n = 0; (long)n < _j->entries; n = n + 1) {
    if (0 < _j->lengthlist[n]) {
      sortindex._4_4_ = sortindex._4_4_ + 1;
    }
  }
  s_local->entries = _j->entries;
  s_local->lengthlist = (long *)(long)sortindex._4_4_;
  s_local->dim = _j->dim;
  if (0 < sortindex._4_4_) {
    aoStack_b0[0] = 0x130c35;
    aoStack_b0[1] = 0;
    codep = (ogg_uint32_t **)_make_words(_j->lengthlist,_j->entries,(long)s_local->lengthlist);
    psVar1 = s_local;
    lVar9 = -((long)sortindex._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
    pvVar5 = (void *)((long)&oStack_a8 + lVar9);
    _orig = pvVar5;
    if (codep == (ogg_uint32_t **)0x0) {
      *(undefined8 *)((long)aoStack_b0 + lVar9) = 0x1311e4;
      vorbis_book_clear((codebook *)psVar1);
      return -1;
    }
    for (n = 0; __base = _orig, n < sortindex._4_4_; n = n + 1) {
      oVar2 = *(ogg_uint32_t *)((long)codep + (long)n * 4);
      *(undefined8 *)((long)aoStack_b0 + lVar9) = 0x130c81;
      oVar2 = bitreverse(oVar2);
      *(ogg_uint32_t *)((long)codep + (long)n * 4) = oVar2;
      *(long *)((long)_orig + (long)n * 8) = (long)codep + (long)n * 4;
    }
    sVar8 = (size_t)sortindex._4_4_;
    *(undefined8 *)((long)aoStack_b0 + lVar9) = 0x130ccd;
    qsort(__base,sVar8,8,sort32a);
    poVar4 = (ogg_uint32_t *)
             ((long)pvVar5 - ((long)sortindex._4_4_ * 4 + 0xfU & 0xfffffffffffffff0));
    lVar9 = (long)sortindex._4_4_;
    codes = poVar4;
    poVar4[-2] = 0x130cf7;
    poVar4[-1] = 0;
    pvVar5 = malloc(lVar9 << 2);
    __ptr = codep;
    s_local->q_delta = (long)pvVar5;
    for (n = 0; n < sortindex._4_4_; n = n + 1) {
      oVar2 = (ogg_uint32_t)(*(long *)((long)_orig + (long)n * 8) - (long)codep >> 2);
      codes[(int)oVar2] = n;
      mask = oVar2;
    }
    for (n = 0; n < sortindex._4_4_; n = n + 1) {
      *(undefined4 *)(s_local->q_delta + (long)(int)codes[n] * 4) =
           *(undefined4 *)((long)codep + (long)n * 4);
    }
    poVar4[-2] = 0x130d89;
    poVar4[-1] = 0;
    free(__ptr);
    psVar1 = _j;
    iVar3 = sortindex._4_4_;
    sparsemap = codes;
    maxpoint = &s_local->maptype;
    poVar4[-2] = 0x130da1;
    poVar4[-1] = 0;
    poVar6 = _book_unquantize(psVar1,iVar3,(int *)sparsemap,maxpoint);
    s_local->q_min = (long)poVar6;
    lVar9 = (long)sortindex._4_4_;
    poVar4[-2] = 0x130db9;
    poVar4[-1] = 0;
    pvVar5 = malloc(lVar9 << 2);
    *(void **)&s_local->q_quant = pvVar5;
    sortindex._4_4_ = 0;
    for (n = 0; (long)n < _j->entries; n = n + 1) {
      if (0 < _j->lengthlist[n]) {
        *(int *)(*(long *)&s_local->q_quant + (long)(int)codes[sortindex._4_4_] * 4) = n;
        sortindex._4_4_ = sortindex._4_4_ + 1;
      }
    }
    sVar8 = (size_t)sortindex._4_4_;
    poVar4[-2] = 0x130e31;
    poVar4[-1] = 0;
    plVar7 = (long *)malloc(sVar8);
    s_local->quantlist = plVar7;
    sortindex._4_4_ = 0;
    for (n = 0; (long)n < _j->entries; n = n + 1) {
      if (0 < _j->lengthlist[n]) {
        *(char *)((long)s_local->quantlist + (long)(int)codes[sortindex._4_4_]) =
             (char)_j->lengthlist[n];
        sortindex._4_4_ = sortindex._4_4_ + 1;
      }
    }
    plVar7 = s_local->lengthlist;
    poVar4[-2] = 0x130eba;
    poVar4[-1] = 0;
    iVar3 = _ilog((uint)plVar7);
    *(int *)&s_local[1].entries = iVar3 + -4;
    if ((int)s_local[1].entries < 5) {
      *(undefined4 *)&s_local[1].entries = 5;
    }
    if (8 < (int)s_local[1].entries) {
      *(undefined4 *)&s_local[1].entries = 8;
    }
    sortindex._0_4_ = 1 << ((byte)(int)s_local[1].entries & 0x1f);
    sVar8 = (size_t)(int)sortindex;
    poVar4[-2] = 0x130f0f;
    poVar4[-1] = 0;
    pvVar5 = calloc(sVar8,4);
    s_local[1].dim = (long)pvVar5;
    *(undefined4 *)((long)&s_local[1].entries + 4) = 0;
    for (n = 0; n < sortindex._4_4_; n = n + 1) {
      if (*(int *)((long)&s_local[1].entries + 4) <
          (int)*(char *)((long)s_local->quantlist + (long)n)) {
        *(int *)((long)&s_local[1].entries + 4) = (int)*(char *)((long)s_local->quantlist + (long)n)
        ;
      }
      if ((int)*(char *)((long)s_local->quantlist + (long)n) <= (int)s_local[1].entries) {
        oVar2 = *(ogg_uint32_t *)(s_local->q_delta + (long)n * 4);
        poVar4[-2] = 0x130f9b;
        poVar4[-1] = 0;
        local_50 = bitreverse(oVar2);
        for (tabn = 0;
            tabn < 1 << ((char)(int)s_local[1].entries -
                         *(char *)((long)s_local->quantlist + (long)n) & 0x1fU); tabn = tabn + 1) {
          *(int *)(s_local[1].dim +
                  (ulong)(local_50 | tabn << (*(byte *)((long)s_local->quantlist + (long)n) & 0x1f))
                  * 4) = n + 1;
          local_84 = local_50;
        }
      }
    }
    lo._4_4_ = (uint)(0xfffffffeL << (0x1fU - (char)(int)s_local[1].entries & 0x3f));
    hi = 0;
    lStack_68 = 0;
    for (n = 0; n < (int)sortindex; n = n + 1) {
      oVar2 = n << (0x20U - (char)(int)s_local[1].entries & 0x1f);
      local_90 = s_local[1].dim;
      loval._4_4_ = oVar2;
      poVar4[-2] = 0x131087;
      poVar4[-1] = 0;
      oVar2 = bitreverse(oVar2);
      x = loval._4_4_;
      if (*(int *)(local_90 + (ulong)oVar2 * 4) == 0) {
        while( true ) {
          local_91 = false;
          if (hi + 1 < (long)sortindex._4_4_) {
            local_91 = *(uint *)(s_local->q_delta + 4 + hi * 4) <= loval._4_4_;
          }
          if (local_91 == false) break;
          hi = hi + 1;
        }
        while( true ) {
          local_92 = false;
          if (lStack_68 < sortindex._4_4_) {
            local_92 = (*(uint *)(s_local->q_delta + lStack_68 * 4) & lo._4_4_) <= loval._4_4_;
          }
          if (local_92 == false) break;
          lStack_68 = lStack_68 + 1;
        }
        hival = hi;
        local_80 = sortindex._4_4_ - lStack_68;
        if (0x7fff < (ulong)hi) {
          hival = 0x7fff;
        }
        if (0x7fff < local_80) {
          local_80 = 0x7fff;
        }
        local_a4 = (uint)(hival << 0xf) | 0x80000000 | (uint)local_80;
        local_a0 = s_local[1].dim;
        poVar4[-2] = 0x1311ac;
        poVar4[-1] = 0;
        oVar2 = bitreverse(x);
        *(uint *)(local_a0 + (ulong)oVar2 * 4) = local_a4;
      }
    }
  }
  return 0;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;
  memset(c,0,sizeof(*c));
  
  /* count actually used entries */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.  
       
       First, we collapse the likely sparse codebook down only to
       actually represented values/words.  This collapsing needs to be
       indexed as map-valueless books are used to encode original entry
       positions as integers.
       
       Second, we reorder all vectors, including the entry index above,
       by sorted bitreversed codeword to allow treeless decode. */
    
    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=(ogg_uint32_t **)alloca(sizeof(*codep)*n);
    
    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=(int *)alloca(n*sizeof(*sortindex));
    c->codelist=(ogg_uint32_t *)_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);
    
    
    
    c->valuelist=_book_unquantize(s,n,sortindex,&c->binarypoint);
    c->dec_index=(int *)_ogg_malloc(n*sizeof(*c->dec_index));
    
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_index[sortindex[n++]]=i;
    
    c->dec_codelengths=(char *)_ogg_malloc(n*sizeof(*c->dec_codelengths));
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
    
    c->dec_firsttablen=_ilog(c->used_entries)-4; /* this is magic */
    if(c->dec_firsttablen<5)c->dec_firsttablen=5;
    if(c->dec_firsttablen>8)c->dec_firsttablen=8;
    
    tabn=1<<c->dec_firsttablen;
    c->dec_firsttable=(ogg_uint32_t *)_ogg_calloc(tabn,sizeof(*c->dec_firsttable));
    c->dec_maxlength=0;
    
    for(i=0;i<n;i++){
      if(c->dec_maxlength<c->dec_codelengths[i])
	c->dec_maxlength=c->dec_codelengths[i];
      if(c->dec_codelengths[i]<=c->dec_firsttablen){
	ogg_uint32_t orig=bitreverse(c->codelist[i]);
	for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
	  c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
      }
    }
    
    /* now fill in 'unused' entries in the firsttable with hi/lo search
       hints for the non-direct-hits */
    {
      ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
      long lo=0,hi=0;
      
      for(i=0;i<tabn;i++){
	ogg_uint32_t word=i<<(32-c->dec_firsttablen);
	if(c->dec_firsttable[bitreverse(word)]==0){
	  while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
	  while(    hi<n && word>=(c->codelist[hi]&mask))hi++;
	  
	  /* we only actually have 15 bits per hint to play with here.
	     In order to overflow gracefully (nothing breaks, efficiency
	     just drops), encode as the difference from the extremes. */
	  {
	    unsigned long loval=lo;
	    unsigned long hival=n-hi;
	    
	    if(loval>0x7fff)loval=0x7fff;
	    if(hival>0x7fff)hival=0x7fff;
	    c->dec_firsttable[bitreverse(word)]=
	      0x80000000UL | (loval<<15) | hival;
	  }
	}
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}